

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainNamingConventions.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint local_34;
  undefined1 local_30 [4];
  uint file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  char **argv_local;
  int argc_local;
  
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  for (local_34 = 1; local_34 < (uint)argc; local_34 = local_34 + 1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_30,
               (char **)(&(filenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                        (ulong)local_34 * 8));
  }
  namingConventions::convertToConventions
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return 0;
}

Assistant:

int main(int argc, char** argv){
std::vector<std::string> filenames;

    for (unsigned int file = 1; file < argc; ++file) {
        filenames.emplace_back(argv[file]);
    }
    namingConventions::convertToConventions(filenames);

//    namingConventions::namingConventionsClasses(filenames);
//    namingConventions::namingConventionsVariables(filenames);
//    namingConventions::namingConventionsFunctions(filenames);

}